

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O0

int generate_by_descriptor_combo
              (miniscript_node_t *node,miniscript_node_t *parent,int32_t derive_child_num,
              uchar *script,size_t script_len,size_t *write_len)

{
  _Bool _Var1;
  size_t *write_len_local;
  size_t script_len_local;
  uchar *script_local;
  int32_t derive_child_num_local;
  miniscript_node_t *parent_local;
  miniscript_node_t *node_local;
  
  _Var1 = has_uncompressed_key_by_child(node);
  if (_Var1) {
    node_local._4_4_ =
         generate_by_descriptor_pkh(node,parent,derive_child_num,script,script_len,write_len);
  }
  else {
    node_local._4_4_ =
         generate_by_descriptor_wpkh(node,parent,derive_child_num,script,script_len,write_len);
  }
  return node_local._4_4_;
}

Assistant:

static int generate_by_descriptor_combo(
    struct miniscript_node_t *node,
    struct miniscript_node_t *parent,
    int32_t derive_child_num,
    unsigned char *script,
    size_t script_len,
    size_t *write_len)
{
    if (has_uncompressed_key_by_child(node)) {
        return generate_by_descriptor_pkh(
            node, parent, derive_child_num, script, script_len, write_len);
    } else {
        return generate_by_descriptor_wpkh(
            node, parent, derive_child_num, script, script_len, write_len);
    }
}